

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_store.cxx
# Opt level: O0

void test_log_store_compact_random(void)

{
  result_type_conflict1 rVar1;
  int iVar2;
  size_type sVar3;
  ulong uVar4;
  function<int_()> *rnd_00;
  ulong uVar5;
  __normal_iterator<std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
  index;
  long lVar6;
  ulong uVar7;
  int __fd;
  EVP_PKEY_CTX *ctx;
  fs_log_store *pfVar8;
  ptr<log_entry> entry_5;
  size_t i_4;
  ptr<log_entry> entry_4;
  int i_3;
  ptr<log_entry> entry_3;
  size_t i_2;
  ptr<log_entry> entry;
  ulong rnd_idx;
  ptr<log_entry> entry_2;
  size_t i_1;
  ulong idx_to_compact;
  ulong last_log_idx;
  ptr<log_entry> entry_1;
  int i;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  entries;
  int cnt;
  fs_log_store store;
  function<int_()> rnd;
  uniform_int_distribution<int> distribution;
  default_random_engine engine;
  random_device rd;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *in_stack_ffffffffffffe3c8;
  function<int_()> *in_stack_ffffffffffffe3d0;
  anon_class_16_2_1b063617 *in_stack_ffffffffffffe3d8;
  undefined4 in_stack_ffffffffffffe3e0;
  undefined4 in_stack_ffffffffffffe3e4;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *in_stack_ffffffffffffe3e8;
  const_iterator in_stack_ffffffffffffe3f0;
  const_iterator in_stack_ffffffffffffe3f8;
  allocator<char> *in_stack_ffffffffffffe400;
  char *in_stack_ffffffffffffe408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe410;
  function<int_()> *in_stack_ffffffffffffe428;
  ptr<log_entry> *entry_00;
  undefined4 in_stack_ffffffffffffe470;
  ulong local_1b78;
  int local_1b5c;
  ulong local_1b48;
  shared_ptr<cornerstone::log_entry> *local_1b40;
  shared_ptr<cornerstone::log_entry> *local_1b38;
  shared_ptr<cornerstone::log_entry> *local_1b28;
  ulong in_stack_ffffffffffffe4e0;
  fs_log_store *in_stack_ffffffffffffe4e8;
  ulong local_1ae8;
  int local_1abc;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  local_1ab8;
  int local_1aa0;
  allocator<char> local_1a99;
  string local_1a98 [136];
  ptr<log_entry> *in_stack_ffffffffffffe5f0;
  ulong in_stack_ffffffffffffe5f8;
  fs_log_store *in_stack_ffffffffffffe600;
  int in_stack_ffffffffffffe6b4;
  string *in_stack_ffffffffffffe6b8;
  fs_log_store *in_stack_ffffffffffffe6c0;
  EVP_PKEY_CTX local_13c8 [64];
  ptr<log_entry> local_1388 [312];
  
  entry_00 = local_1388;
  std::random_device::random_device((random_device *)in_stack_ffffffffffffe410);
  rVar1 = std::random_device::operator()((random_device *)0x13d789);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffe3d0,(result_type_conflict)in_stack_ffffffffffffe3c8);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffe3d0,
             (int)((ulong)in_stack_ffffffffffffe3c8 >> 0x20),(int)in_stack_ffffffffffffe3c8);
  ctx = local_13c8;
  std::function<int()>::function<test_log_store_compact_random()::__0,void>
            ((function<int_()> *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
             in_stack_ffffffffffffe3d8);
  cleanup(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe410,in_stack_ffffffffffffe408,in_stack_ffffffffffffe400);
  cornerstone::fs_log_store::fs_log_store
            (in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8,in_stack_ffffffffffffe6b4);
  std::__cxx11::string::~string(local_1a98);
  std::allocator<char>::~allocator(&local_1a99);
  iVar2 = std::function<int_()>::operator()(in_stack_ffffffffffffe3d0);
  local_1aa0 = iVar2 % 1000 + 100;
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::vector((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
            *)0x13d8a6);
  for (local_1abc = 0; local_1abc < local_1aa0; local_1abc = local_1abc + 1) {
    rnd_entry(in_stack_ffffffffffffe428);
    cornerstone::fs_log_store::append
              ((fs_log_store *)CONCAT44(rVar1,in_stack_ffffffffffffe470),entry_00);
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0),
                (value_type *)in_stack_ffffffffffffe3d8);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13d917);
  }
  sVar3 = std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::size(&local_1ab8);
  iVar2 = std::function<int_()>::operator()(in_stack_ffffffffffffe3d0);
  lVar6 = (ulong)(long)iVar2 % (sVar3 - 10) + 1;
  local_1ae8 = 0;
  while( true ) {
    uVar4 = cornerstone::fs_log_store::next_slot
                      ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0)
                      );
    if ((uVar4 - lVar6) - 1 <= local_1ae8) break;
    cornerstone::fs_log_store::start_index
              ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
    cornerstone::fs_log_store::entry_at(in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13daea);
    local_1ae8 = local_1ae8 + 1;
  }
  iVar2 = std::function<int_()>::operator()(in_stack_ffffffffffffe3d0);
  rnd_00 = (function<int_()> *)(long)iVar2;
  uVar4 = cornerstone::fs_log_store::next_slot
                    ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  uVar5 = cornerstone::fs_log_store::start_index
                    ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  uVar7 = (ulong)rnd_00 % (uVar4 - uVar5);
  uVar4 = cornerstone::fs_log_store::start_index
                    ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  rnd_entry(rnd_00);
  cornerstone::fs_log_store::write_at
            (in_stack_ffffffffffffe600,in_stack_ffffffffffffe5f8,in_stack_ffffffffffffe5f0);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::operator[](&local_1ab8,(uVar7 + uVar4) - 1);
  std::shared_ptr<cornerstone::log_entry>::operator=
            ((shared_ptr<cornerstone::log_entry> *)in_stack_ffffffffffffe3d0,
             (shared_ptr<cornerstone::log_entry> *)in_stack_ffffffffffffe3c8);
  local_1b28 = (shared_ptr<cornerstone::log_entry> *)
               std::
               vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ::begin(in_stack_ffffffffffffe3c8);
  index = __gnu_cxx::
          __normal_iterator<std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
          ::operator+((__normal_iterator<std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
                       *)in_stack_ffffffffffffe3d8,(difference_type)in_stack_ffffffffffffe3d0);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<cornerstone::log_entry>const*,std::vector<std::shared_ptr<cornerstone::log_entry>,std::allocator<std::shared_ptr<cornerstone::log_entry>>>>
  ::__normal_iterator<std::shared_ptr<cornerstone::log_entry>*>
            ((__normal_iterator<const_std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
              *)in_stack_ffffffffffffe3d0,
             (__normal_iterator<std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
              *)in_stack_ffffffffffffe3c8);
  local_1b38 = (shared_ptr<cornerstone::log_entry> *)
               std::
               vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ::end(in_stack_ffffffffffffe3c8);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<cornerstone::log_entry>const*,std::vector<std::shared_ptr<cornerstone::log_entry>,std::allocator<std::shared_ptr<cornerstone::log_entry>>>>
  ::__normal_iterator<std::shared_ptr<cornerstone::log_entry>*>
            ((__normal_iterator<const_std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
              *)in_stack_ffffffffffffe3d0,
             (__normal_iterator<std::shared_ptr<cornerstone::log_entry>_*,_std::vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>_>
              *)in_stack_ffffffffffffe3c8);
  pfVar8 = in_stack_ffffffffffffe4e8;
  local_1b40 = (shared_ptr<cornerstone::log_entry> *)
               std::
               vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ::erase(in_stack_ffffffffffffe3e8,in_stack_ffffffffffffe3f8,in_stack_ffffffffffffe3f0
                      );
  local_1b48 = 0;
  while( true ) {
    uVar7 = local_1b48;
    uVar4 = cornerstone::fs_log_store::next_slot
                      ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0)
                      );
    if ((uVar4 - lVar6) - 1 <= uVar7) break;
    cornerstone::fs_log_store::start_index
              ((fs_log_store *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
    in_stack_ffffffffffffe4e8 = (fs_log_store *)(local_1a98 + 0x20);
    cornerstone::fs_log_store::entry_at(pfVar8,(ulong)index._M_current);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13dd1a);
    local_1b48 = local_1b48 + 1;
  }
  iVar2 = std::function<int_()>::operator()(in_stack_ffffffffffffe3d0);
  local_1aa0 = iVar2 % 100 + 10;
  for (local_1b5c = 0; local_1b5c < local_1aa0; local_1b5c = local_1b5c + 1) {
    rnd_entry(rnd_00);
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 *)CONCAT44(iVar2,in_stack_ffffffffffffe3e0),(value_type *)in_stack_ffffffffffffe3d8
               );
    in_stack_ffffffffffffe4e8 = (fs_log_store *)&stack0xffffffffffffe490;
    cornerstone::fs_log_store::append
              ((fs_log_store *)CONCAT44(rVar1,in_stack_ffffffffffffe470),entry_00);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13dde6);
  }
  local_1b78 = 0;
  while( true ) {
    __fd = (int)in_stack_ffffffffffffe4e8;
    uVar7 = local_1b78;
    uVar4 = cornerstone::fs_log_store::next_slot
                      ((fs_log_store *)CONCAT44(iVar2,in_stack_ffffffffffffe3e0));
    if ((uVar4 - lVar6) - 1 <= uVar7) break;
    cornerstone::fs_log_store::start_index
              ((fs_log_store *)CONCAT44(iVar2,in_stack_ffffffffffffe3e0));
    in_stack_ffffffffffffe4e8 = (fs_log_store *)(local_1a98 + 0x20);
    cornerstone::fs_log_store::entry_at(pfVar8,(ulong)index._M_current);
    std::shared_ptr<cornerstone::log_entry>::~shared_ptr
              ((shared_ptr<cornerstone::log_entry> *)0x13dead);
    local_1b78 = local_1b78 + 1;
  }
  pfVar8 = (fs_log_store *)(local_1a98 + 0x20);
  cornerstone::fs_log_store::close(pfVar8,__fd);
  cleanup((EVP_PKEY_CTX *)pfVar8);
  std::shared_ptr<cornerstone::log_entry>::~shared_ptr
            ((shared_ptr<cornerstone::log_entry> *)0x13dee9);
  std::
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  ::~vector((vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             *)CONCAT44(iVar2,in_stack_ffffffffffffe3e0));
  cornerstone::fs_log_store::~fs_log_store
            ((fs_log_store *)CONCAT44(iVar2,in_stack_ffffffffffffe3e0));
  std::function<int_()>::~function((function<int_()> *)0x13df10);
  std::random_device::~random_device((random_device *)0x13df1d);
  return;
}

Assistant:

void test_log_store_compact_random()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(1, 10000);
    std::function<int32()> rnd = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    cleanup();
    fs_log_store store(".", 1000);
    int cnt = rnd() % 1000 + 100;
    std::vector<ptr<log_entry>> entries;
    for (int i = 0; i < cnt; ++i)
    {
        ptr<log_entry> entry(rnd_entry(rnd));
        store.append(entry);
        entries.push_back(entry);
    }

    ulong last_log_idx = entries.size();
    ulong idx_to_compact = rnd() % (last_log_idx - 10) + 1;
    assert(store.compact(idx_to_compact));

    assert(store.start_index() == (idx_to_compact + 1));
    assert(store.next_slot() == (entries.size() + 1));

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }

    ulong rnd_idx = (ulong)rnd() % (store.next_slot() - store.start_index()) + store.start_index();
    ptr<log_entry> entry = rnd_entry(rnd);
    store.write_at(rnd_idx, entry);
    entries[(size_t)rnd_idx - 1] = entry;
    entries.erase(entries.begin() + (size_t)rnd_idx, entries.end());

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }

    cnt = rnd() % 100 + 10;
    for (int i = 0; i < cnt; ++i)
    {
        ptr<log_entry> entry = rnd_entry(rnd);
        entries.push_back(entry);
        store.append(entry);
    }

    for (size_t i = 0; i < store.next_slot() - idx_to_compact - 1; ++i)
    {
        ptr<log_entry> entry = store.entry_at(store.start_index() + i);
        assert(entry_equals(*entry, *entries[i + (size_t)idx_to_compact]));
    }
    store.close();
    cleanup();
}